

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sesschan.c
# Opt level: O1

Channel * sesschan_new(SshChannel *c,LogContext *logctx,SftpServerVtable *sftpserver_vt,
                      SshServerConfig *ssc)

{
  undefined8 *__s;
  Conf *conf;
  LogContext *pLVar1;
  
  __s = (undefined8 *)safemalloc(1,0x5e8,0);
  memset(__s,0,0x5e8);
  *__s = c;
  __s[0xbb] = &sesschan_channelvt;
  *(undefined4 *)(__s + 0xbc) = 0;
  __s[1] = logctx;
  __s[0xba] = ssc;
  conf = conf_new();
  __s[3] = conf;
  load_open_settings((settings_r *)0x0,conf);
  conf_set_int((Conf *)__s[3],4,0);
  __s[6] = &sesschan_seat_vt;
  __s[5] = &sesschan_logpolicy_vt;
  pLVar1 = log_init((LogPolicy *)(__s + 5),(Conf *)__s[3]);
  __s[2] = pLVar1;
  __s[4] = sftpserver_vt;
  bufchain_init((bufchain *)(__s + 0xb3));
  return (Channel *)(__s + 0xbb);
}

Assistant:

Channel *sesschan_new(SshChannel *c, LogContext *logctx,
                      const SftpServerVtable *sftpserver_vt,
                      const SshServerConfig *ssc)
{
    sesschan *sess = snew(sesschan);
    memset(sess, 0, sizeof(sesschan));

    sess->c = c;
    sess->chan.vt = &sesschan_channelvt;
    sess->chan.initial_fixed_window_size = 0;
    sess->parent_logctx = logctx;
    sess->ssc = ssc;

    /* Start with a completely default Conf */
    sess->conf = conf_new();
    load_open_settings(NULL, sess->conf);

    /* Set close-on-exit = true to suppress pty.c's "[pterm: process
     * terminated with status x]" message */
    conf_set_int(sess->conf, CONF_close_on_exit, FORCE_ON);

    sess->seat.vt = &sesschan_seat_vt;
    sess->logpolicy.vt = &sesschan_logpolicy_vt;
    sess->child_logctx = log_init(&sess->logpolicy, sess->conf);

    sess->sftpserver_vt = sftpserver_vt;

    bufchain_init(&sess->subsys_input);

    return &sess->chan;
}